

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetVariableDatumList
          (Aggregate_State_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
          *VD)

{
  uint uVar1;
  long lVar2;
  pointer pKVar3;
  
  ClearVariableDatumList(this);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ::operator=(&this->m_vVD,VD);
  pKVar3 = (this->m_vVD).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = -(long)pKVar3;
  for (; pKVar3 != (this->m_vVD).
                   super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pKVar3 = pKVar3 + 1) {
    uVar1 = (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[8])();
    (this->super_Header).super_Header6.m_ui16PDULength =
         (short)(uVar1 >> 3) + (this->super_Header).super_Header6.m_ui16PDULength + 8;
    lVar2 = lVar2 + -0x18;
  }
  this->m_ui32NumVariableDatum =
       (KUINT32)(-((long)&((this->m_vVD).
                           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vptr_KRef_Ptr + lVar2) /
                0x18);
  return;
}

Assistant:

void Aggregate_State_PDU::SetVariableDatumList( const vector<VarDtmPtr> & VD )
{
    ClearVariableDatumList();

    m_vVD = VD;

    vector<VarDtmPtr>::const_iterator citr = m_vVD.begin();
    vector<VarDtmPtr>::const_iterator citrEnd = m_vVD.end();
    for( citr = m_vVD.begin(); citr != m_vVD.end(); ++citr )
    {
        m_ui16PDULength += VariableDatum::VARIABLE_DATUM_SIZE + ( ( *citr )->GetDatumLength() / 8 );
    }

    m_ui32NumVariableDatum = m_vVD.size();
}